

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::anon_unknown_6::ScanLineProcess::run_fill
          (ScanLineProcess *this,FrameBuffer *outfb,int fbY,
          vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *filllist)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  ArgExc *this_00;
  long lVar6;
  undefined4 in_register_00000014;
  float *pfVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  int iVar11;
  float *pfVar12;
  half fillVal;
  
  piVar10 = *(int **)CONCAT44(in_register_00000014,fbY);
  piVar5 = (int *)((undefined8 *)CONCAT44(in_register_00000014,fbY))[1];
  do {
    if (piVar10 == piVar5) {
      return;
    }
    iVar1 = (this->cinfo).height;
    lVar6 = *(long *)(piVar10 + 4);
    iVar2 = (this->cinfo).start_y;
    pfVar7 = (float *)((long)((int)outfb / piVar10[9]) * *(long *)(piVar10 + 6) +
                      ((this->cinfo).start_x / piVar10[8]) * lVar6 + *(long *)(piVar10 + 2));
    iVar3 = (this->decoder).user_line_end_ignore;
    for (iVar8 = (int)outfb; iVar8 < (iVar1 + iVar2) - iVar3; iVar8 = iVar8 + 1) {
      if (iVar8 % piVar10[9] == 0) {
        iVar9 = (this->cinfo).start_x;
        iVar11 = (this->cinfo).width + iVar9;
        pfVar12 = pfVar7;
        for (; iVar9 < iVar11; iVar9 = iVar9 + 1) {
          if (iVar9 % piVar10[8] == 0) {
            iVar4 = *piVar10;
            if (iVar4 == 2) {
              *pfVar12 = (float)*(double *)(piVar10 + 10);
            }
            else if (iVar4 == 1) {
              Imath_3_2::half::half(&fillVal,(float)*(double *)(piVar10 + 10));
              *(uint16_t *)pfVar12 = fillVal._h;
              lVar6 = *(long *)(piVar10 + 4);
            }
            else {
              if (iVar4 != 0) {
                this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_3_4::ArgExc::ArgExc(this_00,"Unknown pixel data type.");
                __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
              }
              *pfVar12 = (float)(long)*(double *)(piVar10 + 10);
            }
            pfVar12 = (float *)((long)pfVar12 + lVar6);
          }
        }
        pfVar7 = (float *)((long)pfVar7 + *(long *)(piVar10 + 6));
      }
    }
    piVar10 = piVar10 + 0xe;
  } while( true );
}

Assistant:

void ScanLineProcess::run_fill (
    const FrameBuffer *outfb,
    int fbY,
    const std::vector<Slice> &filllist)
{
    for (auto& s: filllist)
    {
        uint8_t*       ptr;

        ptr  = reinterpret_cast<uint8_t*> (s.base);
        ptr += int64_t (cinfo.start_x / s.xSampling) * int64_t (s.xStride);
        ptr += int64_t (fbY / s.ySampling) * int64_t (s.yStride);

        // TODO: update ImfMisc, lift fill type / value
        int stop = cinfo.start_y + cinfo.height - decoder.user_line_end_ignore;
        for ( int start = fbY; start < stop; ++start )
        {
            if (start % s.ySampling) continue;

            uint8_t* outptr = ptr;
            for ( int sx = cinfo.start_x, ex = cinfo.start_x + cinfo.width;
                  sx < ex; ++sx )
            {
                if (sx % s.xSampling) continue;

                switch (s.type)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:
                    {
                        unsigned int fillVal = (unsigned int) (s.fillValue);
                        *(unsigned int*)outptr = fillVal;
                        break;
                    }

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:
                    {
                        half fillVal = half (s.fillValue);
                        *(half*)outptr = fillVal;
                        break;
                    }

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:
                    {
                        float fillVal = float (s.fillValue);
                        *(float*)outptr = fillVal;
                        break;
                    }
                    default:
                        throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
                }
                outptr += s.xStride;
            }

            ptr += s.yStride;
        }
    }
}